

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O0

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseLengthDelimited
          (UnknownFieldLiteParserHelper *this,uint32 num,char *ptr,ParseContext *ctx)

{
  uint32 uVar1;
  EpsCopyInputStream *in_RCX;
  char *in_RDX;
  undefined4 in_ESI;
  string *in_RDI;
  int size;
  undefined4 in_stack_ffffffffffffffd0;
  int size_00;
  undefined4 in_stack_ffffffffffffffe8;
  char **in_stack_fffffffffffffff8;
  char *pcVar2;
  
  uVar1 = ReadSize(in_stack_fffffffffffffff8);
  if (in_RDX == (char *)0x0) {
    pcVar2 = (char *)0x0;
  }
  else if (*(long *)in_RDI == 0) {
    pcVar2 = EpsCopyInputStream::Skip
                       (in_RCX,(char *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),
                        (int)((ulong)in_RDI >> 0x20));
  }
  else {
    WriteVarint(CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_RDI);
    size_00 = (int)((ulong)in_RCX >> 0x20);
    WriteVarint(CONCAT44(uVar1,in_stack_ffffffffffffffd0),in_RDI);
    pcVar2 = EpsCopyInputStream::AppendString
                       ((EpsCopyInputStream *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_RDX,
                        size_00,(string *)CONCAT44(uVar1,in_stack_ffffffffffffffd0));
  }
  return pcVar2;
}

Assistant:

const char* ParseLengthDelimited(uint32 num, const char* ptr,
                                   ParseContext* ctx) {
    int size = ReadSize(&ptr);
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_ == nullptr) return ctx->Skip(ptr, size);
    WriteVarint(num * 8 + 2, unknown_);
    WriteVarint(size, unknown_);
    return ctx->AppendString(ptr, size, unknown_);
  }